

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd-socket.c
# Opt level: O0

void fdsocket_select_result_input(int fd,int event)

{
  Plug *plug;
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  char local_5018 [4];
  int retd;
  char buf [20480];
  FdSocket *fds;
  int event_local;
  int fd_local;
  
  fds._0_4_ = event;
  fds._4_4_ = fd;
  buf._20472_8_ = find234(fdsocket_by_infd,(void *)((long)&fds + 4),fdsocket_infd_find);
  if ((void *)buf._20472_8_ != (void *)0x0) {
    sVar2 = read(*(int *)(buf._20472_8_ + 4),local_5018,0x5000);
    iVar1 = (int)sVar2;
    if (iVar1 < 1) {
      del234(fdsocket_by_infd,(void *)buf._20472_8_);
      uxsel_del(*(int *)(buf._20472_8_ + 4));
      close(*(int *)(buf._20472_8_ + 4));
      *(undefined4 *)(buf._20472_8_ + 4) = 0xffffffff;
      if (iVar1 < 0) {
        plug = *(Plug **)(buf._20472_8_ + 0x2088);
        piVar3 = __errno_location();
        plug_closing_errno(plug,*piVar3);
      }
      else {
        plug_closing_normal(*(Plug **)(buf._20472_8_ + 0x2088));
      }
    }
    else {
      plug_receive(*(Plug **)(buf._20472_8_ + 0x2088),0,local_5018,(long)iVar1);
    }
  }
  return;
}

Assistant:

static void fdsocket_select_result_input(int fd, int event)
{
    FdSocket *fds;
    char buf[20480];
    int retd;

    if (!(fds = find234(fdsocket_by_infd, &fd, fdsocket_infd_find)))
        return;

    retd = read(fds->infd, buf, sizeof(buf));
    if (retd > 0) {
        plug_receive(fds->plug, 0, buf, retd);
    } else {
        del234(fdsocket_by_infd, fds);
        uxsel_del(fds->infd);
        close(fds->infd);
        fds->infd = -1;

        if (retd < 0) {
            plug_closing_errno(fds->plug, errno);
        } else {
            plug_closing_normal(fds->plug);
        }
    }
}